

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O3

void __thiscall helics::apps::Source::setStartTime(Source *this,string_view key,Time startTime)

{
  iterator iVar1;
  ulong uVar2;
  _Elt_pointer pSVar3;
  ulong uVar4;
  key_type local_20;
  
  local_20._M_str = key._M_str;
  local_20._M_len = key._M_len;
  iVar1 = CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
          ::find(&(this->pubids)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->pubids)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  pSVar3 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar2 = ((long)pSVar3 -
           (long)(this->sources).
                 super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 8) +
          (long)*(int *)&iVar1._M_node[1]._M_left;
  if ((long)uVar2 < 0) {
    uVar4 = (long)uVar2 >> 1;
  }
  else {
    if (uVar2 < 2) {
      pSVar3 = pSVar3 + *(int *)&iVar1._M_node[1]._M_left;
      goto LAB_00287813;
    }
    uVar4 = uVar2 >> 1;
  }
  pSVar3 = (this->sources).
           super__Deque_base<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar4] + uVar2 + uVar4 * -2;
LAB_00287813:
  (pSVar3->nextTime).internalTimeCode = startTime.internalTimeCode;
  return;
}

Assistant:

void Source::setStartTime(std::string_view key, Time startTime)
    {
        auto fnd = pubids.find(key);
        if (fnd != pubids.end()) {
            sources[fnd->second].nextTime = startTime;
        }
    }